

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_commitment_parse
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *input)

{
  int iVar1;
  byte *in_RDX;
  long in_RSI;
  secp256k1_ge ge;
  secp256k1_fe x;
  secp256k1_ge *in_stack_ffffffffffffff58;
  secp256k1_ge *in_stack_ffffffffffffff60;
  secp256k1_fe *in_stack_ffffffffffffffc8;
  secp256k1_ge *in_stack_ffffffffffffffd0;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  }
  else if (in_RDX == (byte *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  }
  else if ((((*in_RDX & 0xfe) == 8) &&
           (iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)&stack0xffffffffffffffb8,in_RDX + 1),
           iVar1 != 0)) &&
          (iVar1 = secp256k1_ge_set_xquad(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8),
          iVar1 != 0)) {
    if ((*in_RDX & 1) != 0) {
      secp256k1_ge_neg(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    secp256k1_pedersen_commitment_save
              ((secp256k1_pedersen_commitment *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
    ;
    return 1;
  }
  return 0;
}

Assistant:

int secp256k1_pedersen_commitment_parse(const secp256k1_context* ctx, secp256k1_pedersen_commitment* commit, const unsigned char *input) {
    secp256k1_fe x;
    secp256k1_ge ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(input != NULL);
    (void) ctx;

    if ((input[0] & 0xFE) != 8 ||
        !secp256k1_fe_set_b32(&x, &input[1]) ||
        !secp256k1_ge_set_xquad(&ge, &x)) {
        return 0;
    }
    if (input[0] & 1) {
        secp256k1_ge_neg(&ge, &ge);
    }
    secp256k1_pedersen_commitment_save(commit, &ge);
    return 1;
}